

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_assertionresult.h
# Opt level: O2

void __thiscall Catch::AssertionResultData::~AssertionResultData(AssertionResultData *this)

{
  std::__cxx11::string::~string((string *)&this->message);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

AssertionResultData() : resultType( ResultWas::Unknown ) {}